

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

ostream * sciplot::gnuplot::multiplotcmd(ostream *out,size_t rows,size_t columns,string *title)

{
  char cVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"#==============================================================================",
             0x4f);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# MULTIPLOT",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"#==============================================================================",
             0x4f);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"set multiplot",0xd);
  if (columns != 0 || rows != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out," layout ",8);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"rowsfirst",9);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"downwards",9);
  if (title->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out," title \"",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(title->_M_dataplus)._M_p,title->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return out;
}

Assistant:

inline auto multiplotcmd(std::ostream& out, std::size_t rows, std::size_t columns, std::string title) -> std::ostream&
{
    out << "#==============================================================================" << std::endl;
    out << "# MULTIPLOT" << std::endl;
    out << "#==============================================================================" << std::endl;
    out << "set multiplot";
    if (rows != 0 || columns != 0)
    {
        out << " layout " << rows << "," << columns;
    }
    out << " " << "rowsfirst";
    out << " " << "downwards";
    if(!title.empty())
    {
        out << " title \"" << title << "\"";
    }
    out << std::endl;
    return out;
}